

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD SearchPathA(LPCSTR lpPath,LPCSTR lpFileName,LPCSTR lpExtension,DWORD nBufferLength,
                 LPSTR lpBuffer,LPSTR *lpFilePart)

{
  long lVar1;
  int iVar2;
  errno_t eVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  char *lpFileName_00;
  char *pcVar7;
  long in_FS_OFFSET;
  char *local_120;
  LPCSTR pNextPath;
  DWORD dw;
  DWORD length;
  size_t FileNameLength;
  size_t PathLength;
  LPCSTR pPathEnd;
  LPCSTR pPathStart;
  CHAR *CanonicalFullPath;
  size_t FullPathLength;
  CHAR *FullPath;
  DWORD nRet;
  LPSTR *lpFilePart_local;
  LPSTR lpBuffer_local;
  DWORD nBufferLength_local;
  LPCSTR lpExtension_local;
  LPCSTR lpFileName_local;
  LPCSTR lpPath_local;
  PathCharString CanonicalFullPathPS;
  PathCharString FullPathPS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FullPath._4_4_ = 0;
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpPath_local);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (lpPath == (LPCSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x466);
    fprintf(_stderr,"lpPath may not be NULL\n");
    SetLastError(0x57);
  }
  else if (lpFileName == (LPCSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","SearchPathA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x46c);
    fprintf(_stderr,"lpFileName may not be NULL\n");
    SetLastError(0x57);
  }
  else if (lpExtension == (LPCSTR)0x0) {
    sVar4 = strlen(lpFileName);
    if ((*lpFileName == '\\') || (local_120 = lpPath, *lpFileName == '/')) {
      if (0x3ff < sVar4) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        SetLastError(0x57);
        goto LAB_00145caf;
      }
      pPathStart = StackString<32UL,_char>::OpenStringBuffer
                             ((StackString<32UL,_char> *)&lpPath_local,0x400);
      if (pPathStart == (char *)0x0) {
        SetLastError(8);
        goto LAB_00145caf;
      }
      pNextPath._0_4_ = GetFullPathNameA(lpFileName,0x401,pPathStart,(LPSTR *)0x0);
      StackString<32UL,_char>::CloseBuffer
                ((StackString<32UL,_char> *)&lpPath_local,(ulong)(DWORD)pNextPath);
      if (0x401 < (DWORD)pNextPath) {
        pPathStart = StackString<32UL,_char>::OpenStringBuffer
                               ((StackString<32UL,_char> *)&lpPath_local,
                                (ulong)((DWORD)pNextPath - 1));
        if (pPathStart == (char *)0x0) {
          SetLastError(8);
          goto LAB_00145caf;
        }
        pNextPath._0_4_ = GetFullPathNameA(lpFileName,(DWORD)pNextPath,pPathStart,(LPSTR *)0x0);
        StackString<32UL,_char>::CloseBuffer
                  ((StackString<32UL,_char> *)&lpPath_local,(ulong)(DWORD)pNextPath);
      }
      if ((DWORD)pNextPath == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        GetLastError();
        SetLastError(0x57);
        goto LAB_00145caf;
      }
      iVar2 = access(pPathStart,0);
      if (iVar2 == 0) {
        FullPath._4_4_ = (DWORD)pNextPath;
      }
    }
    else {
      do {
        while( true ) {
          do {
            while( true ) {
              pcVar7 = local_120;
              if (*local_120 == '\0') goto LAB_00145b45;
              PathLength = (size_t)strchr(local_120,0x3a);
              if ((char *)PathLength == (char *)0x0) {
                sVar5 = strlen(local_120);
                local_120 = local_120 + sVar5;
                PathLength = (size_t)local_120;
              }
              else {
                local_120 = (char *)(PathLength + 1);
              }
              sVar5 = PathLength - (long)pcVar7;
              if (sVar5 + sVar4 + 1 < 0x400) break;
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
            }
          } while (sVar5 == 0);
          lVar6 = sVar5 + sVar4;
          lpFileName_00 =
               StackString<32UL,_char>::OpenStringBuffer
                         ((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count,lVar6 + 1);
          if (lpFileName_00 == (char *)0x0) {
            SetLastError(8);
            goto LAB_00145caf;
          }
          memcpy(lpFileName_00,pcVar7,sVar5);
          lpFileName_00[sVar5] = '/';
          eVar3 = strcpy_s(lpFileName_00 + sVar5 + 1,(lVar6 - sVar5) + 1,lpFileName);
          if (eVar3 != 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            SetLastError(0xce);
            FullPath._4_4_ = 0;
            goto LAB_00145caf;
          }
          StackString<32UL,_char>::CloseBuffer
                    ((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count,lVar6 + 1);
          pPathStart = StackString<32UL,_char>::OpenStringBuffer
                                 ((StackString<32UL,_char> *)&lpPath_local,0x400);
          if (pPathStart == (char *)0x0) {
            SetLastError(8);
            goto LAB_00145caf;
          }
          pNextPath._0_4_ = GetFullPathNameA(lpFileName_00,0x401,pPathStart,(LPSTR *)0x0);
          StackString<32UL,_char>::CloseBuffer
                    ((StackString<32UL,_char> *)&lpPath_local,(ulong)(DWORD)pNextPath);
          if (0x401 < (DWORD)pNextPath) {
            pPathStart = StackString<32UL,_char>::OpenStringBuffer
                                   ((StackString<32UL,_char> *)&lpPath_local,
                                    (ulong)((DWORD)pNextPath - 1));
            pNextPath._0_4_ =
                 GetFullPathNameA(lpFileName_00,(DWORD)pNextPath,pPathStart,(LPSTR *)0x0);
            StackString<32UL,_char>::CloseBuffer
                      ((StackString<32UL,_char> *)&lpPath_local,(ulong)(DWORD)pNextPath);
          }
          if ((DWORD)pNextPath != 0) break;
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          GetLastError();
        }
        iVar2 = access(pPathStart,0);
      } while (iVar2 != 0);
      FullPath._4_4_ = (DWORD)pNextPath;
    }
LAB_00145b45:
    if (FullPath._4_4_ == 0) {
      SetLastError(2);
    }
    else if (FullPath._4_4_ < nBufferLength) {
      if (lpBuffer == (LPSTR)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        SetLastError(0x57);
        FullPath._4_4_ = 0;
      }
      else {
        eVar3 = strcpy_s(lpBuffer,(ulong)nBufferLength,pPathStart);
        if (eVar3 == 0) {
          if (lpFilePart != (LPSTR *)0x0) {
            pcVar7 = strrchr(lpBuffer,0x2f);
            *lpFilePart = pcVar7;
            if (*lpFilePart == (LPSTR)0x0) {
              fprintf(_stderr,"] %s %s:%d","SearchPathA",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                      ,0x52d);
              fprintf(_stderr,"no \'/\' in full path!\n");
            }
            else {
              *lpFilePart = *lpFilePart + 1;
            }
          }
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          SetLastError(0xce);
          FullPath._4_4_ = 0;
        }
      }
    }
    else {
      FullPath._4_4_ = FullPath._4_4_ + 1;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","SearchPathA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
            ,0x472);
    fprintf(_stderr,"lpExtension must be NULL, is %p instead\n",lpExtension);
    SetLastError(0x57);
  }
LAB_00145caf:
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpPath_local);
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&CanonicalFullPathPS.m_count);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return FullPath._4_4_;
}

Assistant:

DWORD
PALAPI
SearchPathA(
    IN LPCSTR lpPath,
    IN LPCSTR lpFileName,
    IN LPCSTR lpExtension,
    IN DWORD nBufferLength,
    OUT LPSTR lpBuffer,
    OUT LPSTR *lpFilePart
    )
{
    DWORD nRet = 0;
    CHAR * FullPath;
    size_t FullPathLength = 0;
    PathCharString FullPathPS;
    PathCharString CanonicalFullPathPS;
    CHAR * CanonicalFullPath;
    LPCSTR pPathStart;
    LPCSTR pPathEnd;
    size_t PathLength;
    size_t FileNameLength;
    DWORD length;
    DWORD dw;

    PERF_ENTRY(SearchPathA);
    ENTRY("SearchPathA(lpPath=%p (%s), lpFileName=%p (%s), lpExtension=%p, "
          "nBufferLength=%u, lpBuffer=%p, lpFilePart=%p)\n",
      lpPath,
      lpPath, lpFileName, lpFileName, lpExtension, nBufferLength, lpBuffer,
          lpFilePart);

    /* validate parameters */

    if(NULL == lpPath)
    {
        ASSERT("lpPath may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL == lpFileName)
    {
        ASSERT("lpFileName may not be NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    if(NULL != lpExtension)
    {
        ASSERT("lpExtension must be NULL, is %p instead\n", lpExtension);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    FileNameLength = strlen(lpFileName);

    /* special case : if file name contains absolute path, don't search the
       provided path */
    if('\\' == lpFileName[0] || '/' == lpFileName[0])
    {
        if(FileNameLength >= MAX_LONGPATH)
        {
            WARN("absolute file name <%s> is too long\n", lpFileName);
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }
        /* Canonicalize the path to deal with back-to-back '/', etc. */
        length = MAX_LONGPATH;
        CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
        if (NULL == CanonicalFullPath)
        {
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        dw = GetFullPathNameA(lpFileName, length+1, CanonicalFullPath, NULL);
        CanonicalFullPathPS.CloseBuffer(dw);

        if (length+1 < dw)
        {
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(lpFileName, dw,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);
        }

        if (dw == 0)
        {
            WARN("couldn't canonicalize path <%s>, error is %#x. failing.\n",
                 lpFileName, GetLastError());
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        /* see if the file exists */
        if(0 == access(CanonicalFullPath, F_OK))
        {
            /* found it */
            nRet = dw;
        }
    }
    else
    {
        LPCSTR pNextPath;

        pNextPath = lpPath;

        while (*pNextPath)
        {
            pPathStart = pNextPath;

            /* get a pointer to the end of the first path in pPathStart */
            pPathEnd = strchr(pPathStart, ':');
            if (!pPathEnd)
            {
                pPathEnd = pPathStart + strlen(pPathStart);
                /* we want to break out of the loop after this pass, so let
                   *pNextPath be '\0' */
                pNextPath = pPathEnd;
            }
            else
            {
                /* point to the next component in the path string */
                pNextPath = pPathEnd+1;
            }

            PathLength = pPathEnd-pPathStart;

            if (PathLength+FileNameLength+1 >= MAX_LONGPATH)
            {
                /* The path+'/'+file length is too long.  Skip it. */
                WARN("path component %.*s is too long, skipping it\n",
                     (int)PathLength, pPathStart);
                continue;
            }
            else if(0 == PathLength)
            {
                /* empty component : there were 2 consecutive ':' */
                continue;
            }

            /* Construct a pathname by concatenating one path from lpPath, '/'
               and lpFileName */
            FullPathLength = PathLength + FileNameLength;
            FullPath = FullPathPS.OpenStringBuffer(FullPathLength+1);
            if (NULL == FullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            memcpy(FullPath, pPathStart, PathLength);
            FullPath[PathLength] = '/';
            if (strcpy_s(&FullPath[PathLength+1], FullPathLength+1-PathLength, lpFileName) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            FullPathPS.CloseBuffer(FullPathLength+1);
            /* Canonicalize the path to deal with back-to-back '/', etc. */
            length = MAX_LONGPATH;
            CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(length);
            if (NULL == CanonicalFullPath)
            {
                SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                goto done;
            }
            dw = GetFullPathNameA(FullPath, length+1,
                                  CanonicalFullPath, NULL);
            CanonicalFullPathPS.CloseBuffer(dw);

            if (length+1 < dw)
            {
                CanonicalFullPath = CanonicalFullPathPS.OpenStringBuffer(dw-1);
                dw = GetFullPathNameA(FullPath, dw,
                                      CanonicalFullPath, NULL);
                CanonicalFullPathPS.CloseBuffer(dw);
            }

            if (dw == 0)
            {
                /* Call failed - possibly low memory.  Skip the path */
                WARN("couldn't canonicalize path <%s>, error is %#x. "
                     "skipping it\n", FullPath, GetLastError());
                continue;
            }

            /* see if the file exists */
            if(0 == access(CanonicalFullPath, F_OK))
            {
                /* found it */
                nRet = dw;
                break;
            }
        }
    }

    if (nRet == 0)
    {
       /* file not found anywhere; say so. in Windows, this always seems to say
          FILE_NOT_FOUND, even if path doesn't exist */
       SetLastError(ERROR_FILE_NOT_FOUND);
    }
    else
    {
        if (nRet < nBufferLength)
        {
            if(NULL == lpBuffer)
            {
                /* Windows merily crashes here, but let's not */
                ERROR("caller told us buffer size was %d, but buffer is NULL\n",
                      nBufferLength);
                SetLastError(ERROR_INVALID_PARAMETER);
                nRet = 0;
                goto done;
            }

            if (strcpy_s(lpBuffer, nBufferLength, CanonicalFullPath) != SAFECRT_SUCCESS)
            {
                ERROR("strcpy_s failed!\n");
                SetLastError( ERROR_FILENAME_EXCED_RANGE );
                nRet = 0;
                goto done;
            }

            if(NULL != lpFilePart)
            {
                *lpFilePart = strrchr(lpBuffer,'/');
                if(NULL == *lpFilePart)
                {
                    ASSERT("no '/' in full path!\n");
                }
                else
                {
                    /* point to character after last '/' */
                    (*lpFilePart)++;
                }
            }
        }
        else
        {
            /* if buffer is too small, report required length, including
               terminating null */
            nRet++;
        }
    }
done:
    LOGEXIT("SearchPathA returns DWORD %u\n", nRet);
    PERF_EXIT(SearchPathA);
    return nRet;
}